

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O2

void uv_loop_delete(uv_loop_t *loop)

{
  uv_loop_t *puVar1;
  int iVar2;
  
  puVar1 = default_loop_ptr;
  iVar2 = uv_loop_close(loop);
  if (iVar2 != 0) {
    __assert_fail("err == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/uv-common.c"
                  ,0x378,"void uv_loop_delete(uv_loop_t *)");
  }
  if (puVar1 != loop) {
    uv__free(loop);
    return;
  }
  return;
}

Assistant:

void uv_loop_delete(uv_loop_t* loop) {
  uv_loop_t* default_loop;
  int err;

  default_loop = default_loop_ptr;

  err = uv_loop_close(loop);
  (void) err;    /* Squelch compiler warnings. */
  assert(err == 0);
  if (loop != default_loop)
    uv__free(loop);
}